

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.cc
# Opt level: O2

void __thiscall Monitor::process(Monitor *this,string *json)

{
  int *piVar1;
  DatagramSocket *this_00;
  double dVar2;
  bool bVar3;
  int iVar4;
  key_type *__lhs;
  reference this_01;
  ostream *poVar5;
  undefined8 *puVar6;
  runtime_error *this_02;
  size_t __n;
  void *__buf;
  char *pcVar7;
  int in_R8D;
  undefined4 uVar8;
  undefined4 uVar9;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  data;
  float local_238 [8];
  iterator it;
  string error;
  _Any_data local_1d8;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  stringstream statsd;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b0;
  ostream local_1a8 [376];
  
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  nlohmann::detail::input_adapter::
  input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ((input_adapter *)&statsd,json);
  local_1c8 = 0;
  uStack_1c0 = 0;
  local_1d8._M_unused._M_object = (void *)0x0;
  local_1d8._8_8_ = 0;
  __n = 1;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse(&data,(input_adapter *)&statsd,(parser_callback_t *)&local_1d8,true);
  std::_Function_base::~_Function_base((_Function_base *)&local_1d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b0);
  if (error._M_string_length != 0) {
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    this_02 = (runtime_error *)operator_new(0x10);
    std::runtime_error::runtime_error(this_02,(string *)&error);
    *puVar6 = this_02;
    __cxa_throw(puVar6,&std::runtime_error*::typeinfo,0);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&statsd);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::begin(&it,&data);
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::end((iterator *)local_238,&data);
    bVar3 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator!=(&it,(iterator *)local_238);
    if (!bVar3) {
      this_00 = (this->statsd_)._M_t.
                super___uniq_ptr_impl<DatagramSocket,_std::default_delete<DatagramSocket>_>._M_t.
                super__Tuple_impl<0UL,_DatagramSocket_*,_std::default_delete<DatagramSocket>_>.
                super__Head_base<0UL,_DatagramSocket_*,_false>._M_head_impl;
      if (this_00 != (DatagramSocket *)0x0) {
        std::__cxx11::stringbuf::str();
        DatagramSocket::send(this_00,(int)&it,__buf,__n,in_R8D);
        std::__cxx11::string::~string((string *)&it);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&statsd);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(&data);
      std::__cxx11::string::~string((string *)&error);
      return;
    }
    __lhs = nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::key(&it);
    this_01 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator*(&it);
    bVar3 = std::operator==(__lhs,"gain");
    if (bVar3) {
      dVar2 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::get<double,_double,_0>(this_01);
      local_238[0] = (float)dVar2;
      std::vector<float,_std::allocator<float>_>::emplace_back<float>
                ((vector<float,_std::allocator<float>_> *)this,local_238);
      poVar5 = std::operator<<(local_1a8,(string *)__lhs);
      std::operator<<(poVar5,":");
      dVar2 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::get<double,_double,_0>(this_01);
      uVar8 = SUB84(dVar2,0);
      uVar9 = (undefined4)((ulong)dVar2 >> 0x20);
LAB_001351b6:
      poVar5 = std::ostream::_M_insert<double>((double)CONCAT44(uVar9,uVar8));
      pcVar7 = "|g";
LAB_001351c5:
      poVar5 = std::operator<<(poVar5,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    else {
      bVar3 = std::operator==(__lhs,"frequency");
      if (bVar3) {
        dVar2 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::get<double,_double,_0>(this_01);
        local_238[0] = (float)dVar2;
        std::vector<float,_std::allocator<float>_>::emplace_back<float>
                  (&(this->stats_).frequency,local_238);
        poVar5 = std::operator<<(local_1a8,(string *)__lhs);
        poVar5 = std::operator<<(poVar5,":0|g");
        std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<(local_1a8,(string *)__lhs);
        std::operator<<(poVar5,":");
        dVar2 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::get<double,_double,_0>(this_01);
        uVar8 = SUB84(dVar2,0);
        uVar9 = (undefined4)((ulong)dVar2 >> 0x20);
        goto LAB_001351b6;
      }
      bVar3 = std::operator==(__lhs,"omega");
      if (bVar3) {
        dVar2 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::get<double,_double,_0>(this_01);
        local_238[0] = (float)dVar2;
        std::vector<float,_std::allocator<float>_>::emplace_back<float>
                  (&(this->stats_).omega,local_238);
        poVar5 = std::operator<<(local_1a8,(string *)__lhs);
        std::operator<<(poVar5,":");
        dVar2 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::get<double,_double,_0>(this_01);
        uVar8 = SUB84(dVar2,0);
        uVar9 = (undefined4)((ulong)dVar2 >> 0x20);
        goto LAB_001351b6;
      }
      bVar3 = std::operator==(__lhs,"viterbi_errors");
      if (bVar3) {
        local_238[0] = (float)nlohmann::
                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              ::get<int,_int,_0>(this_01);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  (&(this->stats_).viterbiErrors,(int *)local_238);
        poVar5 = std::operator<<(local_1a8,(string *)__lhs);
        poVar5 = std::operator<<(poVar5,":");
        iVar4 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::get<int,_int,_0>(this_01);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
        pcVar7 = "|h";
        goto LAB_001351c5;
      }
      bVar3 = std::operator==(__lhs,"reed_solomon_errors");
      if (bVar3) {
        local_238[0] = (float)nlohmann::
                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              ::get<int,_int,_0>(this_01);
        if (-1 < (int)local_238[0]) {
          std::vector<int,_std::allocator<int>_>::push_back
                    (&(this->stats_).reedSolomonErrors,(value_type_conflict3 *)local_238);
          poVar5 = std::operator<<(local_1a8,(string *)__lhs);
          poVar5 = std::operator<<(poVar5,":");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)local_238[0]);
          poVar5 = std::operator<<(poVar5,"|h");
          std::endl<char,std::char_traits<char>>(poVar5);
        }
      }
      else {
        bVar3 = std::operator==(__lhs,"ok");
        if (bVar3) {
          iVar4 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  ::get<int,_int,_0>(this_01);
          if (iVar4 == 0) {
            piVar1 = &(this->stats_).totalDropped;
            *piVar1 = *piVar1 + 1;
            poVar5 = std::operator<<(local_1a8,"packets_ok:0|c");
            std::endl<char,std::char_traits<char>>(poVar5);
            pcVar7 = "packets_dropped:1|c";
          }
          else {
            piVar1 = &(this->stats_).totalOK;
            *piVar1 = *piVar1 + 1;
            poVar5 = std::operator<<(local_1a8,"packets_ok:1|c");
            std::endl<char,std::char_traits<char>>(poVar5);
            pcVar7 = "packets_dropped:0|c";
          }
          poVar5 = std::operator<<(local_1a8,pcVar7);
          std::endl<char,std::char_traits<char>>(poVar5);
        }
      }
    }
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::operator++(&it);
  } while( true );
}

Assistant:

void Monitor::process(const std::string& json) {
  std::string error;
  auto data = json::parse(json);
  if (!error.empty()) {
    throw new std::runtime_error(error);
  }

  // Accumulate statsd compatible payload
  std::stringstream statsd;

  for (json::iterator it = data.begin(); it != data.end(); ++it) {
    const auto& key = it.key();
    const auto& value = it.value();

    if (key == "gain") {
      stats_.gain.push_back(value.get<double>());
      statsd << key << ":" << value.get<double>() << "|g" << std::endl;
      continue;
    }

    if (key == "frequency") {
      stats_.frequency.push_back(value.get<double>());
      // First set to 0 to support negative values.
      // See: https://github.com/etsy/statsd/blob/master/docs/metric_types.md#gauges
      statsd << key << ":0|g" << std::endl;
      statsd << key << ":" << value.get<double>() << "|g" << std::endl;
      continue;
    }

    if (key == "omega") {
      stats_.omega.push_back(value.get<double>());
      statsd << key << ":" << value.get<double>() << "|g" << std::endl;
      continue;
    }

    if (key == "viterbi_errors") {
      stats_.viterbiErrors.push_back(value.get<int>());
      statsd << key << ":" << value.get<int>() << "|h" << std::endl;
      continue;
    }

    if (key == "reed_solomon_errors") {
      const auto& v = value.get<int>();
      if (v >= 0) {
        stats_.reedSolomonErrors.push_back(v);
        statsd << key << ":" << v << "|h" << std::endl;
      }
      continue;
    }

    if (key == "ok") {
      const auto& ok = value.get<int>();
      if (ok != 0) {
        stats_.totalOK++;
        statsd << "packets_ok:1|c" << std::endl;
        statsd << "packets_dropped:0|c" << std::endl;
      } else {
        stats_.totalDropped++;
        statsd << "packets_ok:0|c" << std::endl;
        statsd << "packets_dropped:1|c" << std::endl;
      }
      continue;
    }
  }

  if (statsd_) {
    statsd_->send(statsd.str());
  }
}